

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O2

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::
updateMeasurementCovarianceMatrix_(ModelBaseEKFFlexEstimatorIMU *this)

{
  Matrix *_this;
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Index i;
  ulong uVar4;
  long startRow;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_c0;
  IdentityReturnType local_80;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_68;
  
  _this = &this->R_;
  lVar1 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  if (lVar1 != CONCAT44(extraout_var,iVar2)) {
    lVar1 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0x14])(this);
    iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0x14])(this);
    Eigen::internal::
    conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
    ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)_this,
          CONCAT44(extraout_var_00,iVar2),CONCAT44(extraout_var_01,iVar3));
    startRow = 6;
    if ((this->useFTSensors_ == true) &&
       (uVar4 = (ulong)((this->functor_).nbContacts_ * 6), lVar1 < (long)(uVar4 + 6))) {
      startRow = 6;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_c0,_this,6
                 ,0,uVar4,6);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_c0,_this,0
                 ,6,6,(ulong)((this->functor_).nbContacts_ * 6));
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_c0);
      for (uVar4 = 0; uVar4 < (this->functor_).nbContacts_; uVar4 = uVar4 + 1) {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_c0,_this
                   ,startRow,startRow,6,6);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_c0,
                   &this->forceVariance_);
        startRow = startRow + 6;
      }
    }
    if ((lVar1 < startRow + 6 & this->withAbsolutePos_) == 1) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_c0,_this,
                 startRow,0,6,startRow);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_c0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_c0,_this,0
                 ,startRow,startRow,6);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              &local_c0);
      Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_80,6,6);
      Eigen::
      MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
      ::operator*(&local_c0,
                  (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                   *)&local_80,&this->absPosVariance_);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_68,_this,startRow,startRow,6,6);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                (&local_68,&local_c0);
    }
  }
  KalmanFilterBase::setR
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,_this);
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::updateMeasurementCovarianceMatrix_()
{

  if(R_.rows() != getMeasurementSize())
  {

    Index realIndex = R_.rows();
    R_.conservativeResize(getMeasurementSize(), getMeasurementSize());

    Index currIndex = 6;
    if(useFTSensors_)
    {
      /// if the force part of the matrix is not filled
      if(realIndex < currIndex + functor_.getContactsNumber() * 6)
      {
        R_.block(currIndex, 0, functor_.getContactsNumber() * 6, currIndex).setZero();
        R_.block(0, currIndex, currIndex, functor_.getContactsNumber() * 6).setZero();
        for(Index i = 0; i < functor_.getContactsNumber(); ++i)
        {
          R_.block(currIndex, currIndex, 6, 6) = forceVariance_;
          currIndex += 6;
        }
      }
    }

    if(withAbsolutePos_)
    {
      if(realIndex < currIndex + 6)
      {

        R_.block(currIndex, 0, 6, currIndex).setZero();
        R_.block(0, currIndex, currIndex, 6).setZero();
        R_.block(currIndex, currIndex, 6, 6) = Matrix::Identity(6, 6) * absPosVariance_;

        currIndex += 6;
      }
    }
  }
  ekf_.setR(R_);
}